

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O0

int dwarf_srclines_subprog_count
              (Dwarf_Line_Context line_context,Dwarf_Signed *count_out,Dwarf_Error *error)

{
  Dwarf_Signed co;
  Dwarf_Error *error_local;
  Dwarf_Signed *count_out_local;
  Dwarf_Line_Context line_context_local;
  
  if (line_context == (Dwarf_Line_Context)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    line_context_local._4_4_ = 1;
  }
  else if (line_context->lc_magic == 0xd00d1111) {
    if (count_out != (Dwarf_Signed *)0x0) {
      if ((long)line_context->lc_subprogs_count < 0) {
        _dwarf_error_string(line_context->lc_dbg,error,500,
                            "DW_DLE_LINE_COUNT_WRONG Call to dwarf_srclines_subprog_count finds an Impossible subprogs count"
                           );
        return 1;
      }
      *count_out = line_context->lc_subprogs_count;
    }
    line_context_local._4_4_ = 0;
  }
  else {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    line_context_local._4_4_ = 1;
  }
  return line_context_local._4_4_;
}

Assistant:

int
dwarf_srclines_subprog_count(Dwarf_Line_Context line_context,
    Dwarf_Signed * count_out,
    Dwarf_Error * error)
{
    if (!line_context ){
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if (line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if (count_out) {
        Dwarf_Signed co =
            (Dwarf_Signed) line_context->lc_subprogs_count;
        if (co < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_COUNT_WRONG,
                "DW_DLE_LINE_COUNT_WRONG "
                "Call to dwarf_srclines_subprog_count "
                "finds an Impossible "
                "subprogs count");
            return DW_DLV_ERROR;
        }
        *count_out = co;
    }
    return DW_DLV_OK;
}